

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uchar uVar1;
  uchar *puVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  size_t deflatesize;
  uchar *deflatedata;
  ucvector local_78;
  size_t local_60;
  uchar *local_58;
  uint local_4c;
  ulong *local_48;
  uchar **local_40;
  ulong local_38;
  
  local_58 = (uchar *)0x0;
  local_60 = 0;
  local_78.data = *out;
  uVar6 = *outsize;
  uVar4 = uVar6 + 1;
  puVar2 = local_78.data;
  uVar5 = uVar6;
  local_40 = out;
  if (uVar4 == 0) {
LAB_00109093:
    local_78.allocsize = uVar5;
    local_78.data = puVar2;
    local_78.data[uVar6] = 'x';
    local_78.size = uVar4;
  }
  else {
    uVar5 = uVar4 * 3 >> 1;
    if (uVar6 * 2 < uVar4) {
      uVar5 = uVar4;
    }
    local_78.size = uVar6;
    local_78.allocsize = uVar6;
    puVar2 = (uchar *)realloc(local_78.data,uVar5);
    if (puVar2 != (uchar *)0x0) goto LAB_00109093;
  }
  sVar8 = local_78.size;
  uVar5 = local_78.size + 1;
  puVar2 = local_78.data;
  uVar6 = local_78.allocsize;
  if (local_78.allocsize < uVar5) {
    uVar6 = uVar5 * 3 >> 1;
    if (local_78.allocsize * 2 < uVar5) {
      uVar6 = uVar5;
    }
    puVar2 = (uchar *)realloc(local_78.data,uVar6);
    if (puVar2 == (uchar *)0x0) goto LAB_001090f0;
  }
  local_78.allocsize = uVar6;
  local_78.data = puVar2;
  local_78.data[sVar8] = '\x01';
  local_78.size = uVar5;
LAB_001090f0:
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    local_4c = lodepng_deflate(&local_58,&local_60,in,insize,settings);
  }
  else {
    local_4c = (*settings->custom_deflate)(&local_58,&local_60,in,insize,settings);
  }
  if (local_4c == 0) {
    if ((int)insize == 0) {
      uVar12 = 1;
    }
    else {
      uVar12 = 1;
      uVar13 = 0;
      do {
        uVar14 = (uint)insize;
        uVar9 = 0x15ae;
        if (uVar14 < 0x15ae) {
          uVar9 = uVar14;
        }
        uVar10 = uVar14;
        if (0x15ad < (insize & 0xffffffff)) {
          uVar10 = 0x15ae;
        }
        lVar11 = 0;
        do {
          uVar12 = uVar12 + in[lVar11];
          uVar13 = uVar13 + uVar12;
          lVar11 = lVar11 + 1;
        } while (uVar10 != (uint)lVar11);
        uVar12 = uVar12 % 0xfff1;
        uVar13 = uVar13 % 0xfff1;
        in = in + (ulong)(uVar9 - 1) + 1;
        insize = (size_t)(uVar14 - uVar9);
      } while (uVar14 - uVar9 != 0);
      uVar12 = uVar13 << 0x10 | uVar12;
    }
    puVar2 = local_78.data;
    uVar6 = local_78.size;
    sVar15 = local_78.allocsize;
    local_48 = outsize;
    if (local_60 != 0) {
      sVar7 = 0;
      sVar8 = local_78.size;
      do {
        uVar1 = local_58[sVar7];
        uVar5 = sVar8 + 1;
        puVar3 = puVar2;
        uVar4 = sVar15;
        if (sVar15 < uVar5) {
          uVar4 = uVar5 * 3 >> 1;
          if (sVar15 * 2 < uVar5) {
            uVar4 = uVar5;
          }
          local_38 = sVar8;
          puVar3 = (uchar *)realloc(puVar2,uVar4);
          uVar6 = local_38;
          if (puVar3 != (uchar *)0x0) goto LAB_00109224;
        }
        else {
LAB_00109224:
          puVar3[sVar8] = uVar1;
          puVar2 = puVar3;
          uVar6 = uVar5;
          sVar15 = uVar4;
        }
        sVar7 = sVar7 + 1;
        sVar8 = uVar6;
      } while (sVar7 != local_60);
    }
    local_78.data = puVar2;
    local_78.size = uVar6;
    local_78.allocsize = sVar15;
    free(local_58);
    lodepng_add32bitInt(&local_78,uVar12);
    outsize = local_48;
  }
  *local_40 = local_78.data;
  *outsize = local_78.size;
  return local_4c;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings)
{
  /*initially, *out must be NULL and outsize 0, if you just give some random *out
  that's pointing to a non allocated buffer, this'll crash*/
  ucvector outv;
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
  unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
  unsigned FLEVEL = 0;
  unsigned FDICT = 0;
  unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
  unsigned FCHECK = 31 - CMFFLG % 31;
  CMFFLG += FCHECK;

  /*ucvector-controlled version of the output buffer, for dynamic array*/
  ucvector_init_buffer(&outv, *out, *outsize);

  ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
  ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  if(!error)
  {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    for(i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
    lodepng_free(deflatedata);
    lodepng_add32bitInt(&outv, ADLER32);
  }

  *out = outv.data;
  *outsize = outv.size;

  return error;
}